

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderNextDocid
              (Fts3Table *pTab,Fts3SegReader *pReader,char **ppOffsetList,int *pnOffsetList)

{
  char *pcVar1;
  char *pcVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  byte *local_50;
  u8 bEof;
  undefined7 uStack_47;
  Fts3Table *local_40;
  int *local_38;
  
  pbVar7 = (byte *)pReader->pOffsetList;
  local_50 = pbVar7;
  if ((pTab->bDescIdx == '\0') || (pReader->ppNextElem == (Fts3HashElem **)0x0)) {
    iVar5 = pReader->nDoclist;
    pcVar1 = pReader->aDoclist;
    bVar3 = 0;
    local_40 = pTab;
    local_38 = pnOffsetList;
    do {
      for (; *pbVar7 != 0 || bVar3 != 0; pbVar7 = pbVar7 + 1) {
        bVar3 = *pbVar7 & 0x80;
      }
      if ((pReader->pBlob == (sqlite3_blob *)0x0) || (pbVar7 < pReader->aNode + pReader->nPopulate))
      {
        pbVar7 = pbVar7 + 1;
        if (ppOffsetList != (char **)0x0) {
          pcVar2 = pReader->pOffsetList;
          *ppOffsetList = pcVar2;
          *local_38 = ~(uint)pcVar2 + (int)pbVar7;
        }
        while( true ) {
          if (pcVar1 + iVar5 <= pbVar7) {
            pReader->pOffsetList = (char *)0x0;
            return 0;
          }
          if (*pbVar7 != 0) break;
          pbVar7 = pbVar7 + 1;
        }
        local_50 = pbVar7;
        iVar5 = fts3SegReaderRequire(pReader,(char *)pbVar7,10);
        if (iVar5 != 0) {
          return 0;
        }
        iVar5 = sqlite3Fts3GetVarint((char *)pbVar7,(sqlite_int64 *)&bEof);
        pReader->pOffsetList = (char *)(pbVar7 + iVar5);
        lVar6 = -CONCAT71(uStack_47,bEof);
        if (local_40->bDescIdx == '\0') {
          lVar6 = CONCAT71(uStack_47,bEof);
        }
        pReader->iDocid = pReader->iDocid + lVar6;
        return 0;
      }
      iVar4 = fts3SegReaderIncrRead(pReader);
    } while (iVar4 == 0);
  }
  else {
    bEof = '\0';
    if (ppOffsetList != (char **)0x0) {
      *ppOffsetList = (char *)pbVar7;
      *pnOffsetList = pReader->nOffsetList + -1;
    }
    iVar4 = 0;
    sqlite3Fts3DoclistPrev
              (0,pReader->aDoclist,pReader->nDoclist,(char **)&local_50,&pReader->iDocid,
               &pReader->nOffsetList,&bEof);
    if (bEof != '\0') {
      local_50 = (byte *)0x0;
    }
    pReader->pOffsetList = (char *)local_50;
  }
  return iVar4;
}

Assistant:

static int fts3SegReaderNextDocid(
  Fts3Table *pTab,
  Fts3SegReader *pReader,         /* Reader to advance to next docid */
  char **ppOffsetList,            /* OUT: Pointer to current position-list */
  int *pnOffsetList               /* OUT: Length of *ppOffsetList in bytes */
){
  int rc = SQLITE_OK;
  char *p = pReader->pOffsetList;
  char c = 0;

  assert( p );

  if( pTab->bDescIdx && fts3SegReaderIsPending(pReader) ){
    /* A pending-terms seg-reader for an FTS4 table that uses order=desc.
    ** Pending-terms doclists are always built up in ascending order, so
    ** we have to iterate through them backwards here. */
    u8 bEof = 0;
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = pReader->nOffsetList - 1;
    }
    sqlite3Fts3DoclistPrev(0,
        pReader->aDoclist, pReader->nDoclist, &p, &pReader->iDocid,
        &pReader->nOffsetList, &bEof
    );
    if( bEof ){
      pReader->pOffsetList = 0;
    }else{
      pReader->pOffsetList = p;
    }
  }else{
    char *pEnd = &pReader->aDoclist[pReader->nDoclist];

    /* Pointer p currently points at the first byte of an offset list. The
    ** following block advances it to point one byte past the end of
    ** the same offset list. */
    while( 1 ){
  
      /* The following line of code (and the "p++" below the while() loop) is
      ** normally all that is required to move pointer p to the desired 
      ** position. The exception is if this node is being loaded from disk
      ** incrementally and pointer "p" now points to the first byte past
      ** the populated part of pReader->aNode[].
      */
      while( *p | c ) c = *p++ & 0x80;
      assert( *p==0 );
  
      if( pReader->pBlob==0 || p<&pReader->aNode[pReader->nPopulate] ) break;
      rc = fts3SegReaderIncrRead(pReader);
      if( rc!=SQLITE_OK ) return rc;
    }
    p++;
  
    /* If required, populate the output variables with a pointer to and the
    ** size of the previous offset-list.
    */
    if( ppOffsetList ){
      *ppOffsetList = pReader->pOffsetList;
      *pnOffsetList = (int)(p - pReader->pOffsetList - 1);
    }

    /* List may have been edited in place by fts3EvalNearTrim() */
    while( p<pEnd && *p==0 ) p++;
  
    /* If there are no more entries in the doclist, set pOffsetList to
    ** NULL. Otherwise, set Fts3SegReader.iDocid to the next docid and
    ** Fts3SegReader.pOffsetList to point to the next offset list before
    ** returning.
    */
    if( p>=pEnd ){
      pReader->pOffsetList = 0;
    }else{
      rc = fts3SegReaderRequire(pReader, p, FTS3_VARINT_MAX);
      if( rc==SQLITE_OK ){
        sqlite3_int64 iDelta;
        pReader->pOffsetList = p + sqlite3Fts3GetVarint(p, &iDelta);
        if( pTab->bDescIdx ){
          pReader->iDocid -= iDelta;
        }else{
          pReader->iDocid += iDelta;
        }
      }
    }
  }

  return SQLITE_OK;
}